

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

TextureGatherCase *
deqp::gles31::Functional::anon_unknown_0::makeTextureGatherCase
          (TextureType textureType,Context *context,char *name,char *description,
          GatherType gatherType,OffsetSize offsetSize,TextureFormat textureFormat,
          CompareMode shadowCompareMode,WrapMode wrapS,WrapMode wrapT,
          MaybeTextureSwizzle *texSwizzle,FilterMode minFilter,FilterMode magFilter,int baseLevel,
          IVec3 *textureSize,deUint32 flags)

{
  undefined4 uVar1;
  TextureGatherCase *this;
  undefined4 in_stack_00000044;
  deUint32 dVar2;
  TextureFormat local_40;
  Vector<int,_2> local_38;
  
  if (textureType == TEXTURETYPE_2D_ARRAY) {
    dVar2 = 0x1370a27;
    this = (TextureGatherCase *)operator_new(400);
    TextureGatherCase::TextureGatherCase
              (this,context,name,(char *)0x2,(TextureType)description,gatherType,offsetSize,
               (TextureFormat)((ulong)textureFormat & 0xffffffff),shadowCompareMode,wrapS,wrapT,
               (MaybeTextureSwizzle *)((ulong)texSwizzle & 0xffffffff),minFilter,magFilter,
               (int)textureSize,dVar2);
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureGather2DArrayCase_01e587a8;
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)(this + 1),(Vector<int,_3> *)CONCAT44(in_stack_00000044,baseLevel))
    ;
    this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
    local_40.order = CHANNELORDER_LAST;
    local_40.type = CHANNELTYPE_LAST;
    tcu::Texture2DArray::Texture2DArray
              ((Texture2DArray *)
               &this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2,&local_40,1,1,1)
    ;
    this[1].m_gatherType = GATHERTYPE_BASIC;
    this[1].m_offsetSize = OFFSETSIZE_NONE;
    this[1].m_textureFormat.order = R;
    this[1].m_textureFormat.type = SNORM_INT8;
    this[1].m_shadowCompareMode = COMPAREMODE_NONE;
    this[1].m_wrapS = CLAMP_TO_EDGE;
  }
  else if (textureType == TEXTURETYPE_CUBE) {
    dVar2 = 0x1370966;
    this = (TextureGatherCase *)operator_new(0x298);
    uVar1 = *(undefined4 *)CONCAT44(in_stack_00000044,baseLevel);
    TextureGatherCase::TextureGatherCase
              (this,context,name,&DAT_00000001,TEXTURETYPE_2D,GATHERTYPE_BASIC,offsetSize,
               (TextureFormat)((ulong)textureFormat & 0xffffffff),shadowCompareMode,wrapS,wrapT,
               (MaybeTextureSwizzle *)((ulong)texSwizzle & 0xffffffff),minFilter,magFilter,
               (int)textureSize,dVar2);
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureGatherCubeCase_01e58828;
    *(undefined4 *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar1;
    this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    local_40.order = CHANNELORDER_LAST;
    local_40.type = CHANNELTYPE_LAST;
    tcu::TextureCube::TextureCube
              ((TextureCube *)
               &this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length,
               &local_40,1);
    this[2].m_textureFormat.order = R;
    this[2].m_textureFormat.type = SNORM_INT8;
    this[2].m_shadowCompareMode = COMPAREMODE_NONE;
    this[2].m_wrapS = CLAMP_TO_EDGE;
    this[2].m_wrapT = CLAMP_TO_EDGE;
    this[2].m_textureSwizzle.m_swizzle.m_data[0] = TEXTURESWIZZLECOMPONENT_R;
  }
  else if (textureType == TEXTURETYPE_2D) {
    dVar2 = 0x1370880;
    this = (TextureGatherCase *)operator_new(0x180);
    local_38.m_data = *(int (*) [2])CONCAT44(in_stack_00000044,baseLevel);
    TextureGatherCase::TextureGatherCase
              (this,context,name,(char *)0x0,(TextureType)description,gatherType,offsetSize,
               (TextureFormat)((ulong)textureFormat & 0xffffffff),shadowCompareMode,wrapS,wrapT,
               (MaybeTextureSwizzle *)((ulong)texSwizzle & 0xffffffff),minFilter,magFilter,
               (int)textureSize,dVar2);
    (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureGather2DCase_01e58598;
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)(this + 1),&local_38);
    this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    local_40.order = CHANNELORDER_LAST;
    local_40.type = CHANNELTYPE_LAST;
    tcu::Texture2D::Texture2D
              ((Texture2D *)
               &this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length,
               &local_40,1,1);
    *(pointer *)
     ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_children.
             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
             super__Vector_impl_data + 0x10) = (pointer)0x0;
    this[1].super_TestCase.m_context = (Context *)0x0;
    this[1].m_gatherType = GATHERTYPE_BASIC;
    this[1].m_offsetSize = OFFSETSIZE_NONE;
  }
  else {
    this = (TextureGatherCase *)0x0;
  }
  return this;
}

Assistant:

static inline TextureGatherCase* makeTextureGatherCase (TextureType					textureType,
														Context&					context,
														const char*					name,
														const char*					description,
														GatherType					gatherType,
														OffsetSize					offsetSize,
														tcu::TextureFormat			textureFormat,
														tcu::Sampler::CompareMode	shadowCompareMode,
														tcu::Sampler::WrapMode		wrapS,
														tcu::Sampler::WrapMode		wrapT,
														const MaybeTextureSwizzle&	texSwizzle,
														tcu::Sampler::FilterMode	minFilter,
														tcu::Sampler::FilterMode	magFilter,
														int							baseLevel,
														const IVec3&				textureSize,
														deUint32					flags = 0)
{
	switch (textureType)
	{
		case TEXTURETYPE_2D:
			return new TextureGather2DCase(context, name, description, gatherType, offsetSize, textureFormat, shadowCompareMode,
										   wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize.swizzle(0, 1));

		case TEXTURETYPE_2D_ARRAY:
			return new TextureGather2DArrayCase(context, name, description, gatherType, offsetSize, textureFormat, shadowCompareMode,
												wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize);

		case TEXTURETYPE_CUBE:
			DE_ASSERT(gatherType == GATHERTYPE_BASIC);
			DE_ASSERT(offsetSize == OFFSETSIZE_NONE);
			return new TextureGatherCubeCase(context, name, description, textureFormat, shadowCompareMode,
											 wrapS, wrapT, texSwizzle, minFilter, magFilter, baseLevel, flags, textureSize.x());

		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}